

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkle_tree.cpp
# Opt level: O0

vector<sha256_hash> * __thiscall
libtorrent::aux::merkle_tree::get_piece_layer
          (vector<sha256_hash> *__return_storage_ptr__,merkle_tree *this)

{
  sha256_hash pad;
  int iVar1;
  size_type sVar2;
  span<const_libtorrent::digest32<256L>_> sVar3;
  digest32<256L> local_e8;
  span<const_libtorrent::digest32<256L>_> local_c8;
  sha256_hash local_b8;
  span<const_libtorrent::digest32<256L>_> local_98;
  digest32<256L> *pdStack_88;
  span<const_libtorrent::digest32<256L>_> leafs;
  int b;
  int blocks_in_piece;
  vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_> scratch_space;
  __normal_iterator<const_libtorrent::digest32<256L>_*,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
  local_50;
  digest32<256L> *local_48;
  __normal_iterator<const_libtorrent::digest32<256L>_*,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
  local_30;
  __normal_iterator<const_libtorrent::digest32<256L>_*,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
  local_28;
  undefined1 local_19;
  merkle_tree *local_18;
  merkle_tree *this_local;
  vector<sha256_hash> *ret;
  
  local_19 = 0;
  local_18 = this;
  this_local = (merkle_tree *)__return_storage_ptr__;
  container_wrapper<libtorrent::digest32<256L>,_int,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
  ::container_wrapper(__return_storage_ptr__);
  switch(this->m_mode) {
  case uninitialized_tree:
    break;
  case empty_tree:
    break;
  case full_tree:
    local_30._M_current =
         (digest32<256L> *)
         ::std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>::
         begin(&(this->m_tree).
                super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
              );
    iVar1 = piece_layer_start(this);
    local_28 = __gnu_cxx::
               __normal_iterator<const_libtorrent::digest32<256L>_*,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
               ::operator+(&local_30,(long)iVar1);
    scratch_space.
    super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)::std::
                  vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>::
                  begin(&(this->m_tree).
                         super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                       );
    iVar1 = piece_layer_start(this);
    local_50 = __gnu_cxx::
               __normal_iterator<const_libtorrent::digest32<256L>_*,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
               ::operator+((__normal_iterator<const_libtorrent::digest32<256L>_*,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
                            *)&scratch_space.
                               super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)iVar1);
    iVar1 = num_pieces(this);
    local_48 = (digest32<256L> *)
               __gnu_cxx::
               __normal_iterator<const_libtorrent::digest32<256L>_*,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
               ::operator+(&local_50,(long)iVar1);
    ::std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>::
    assign<__gnu_cxx::__normal_iterator<libtorrent::digest32<256l>const*,std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>>,void>
              ((vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>> *)
               __return_storage_ptr__,local_28,
               (__normal_iterator<const_libtorrent::digest32<256L>_*,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
                )local_48);
    break;
  case piece_layer:
    container_wrapper<libtorrent::digest32<256L>,_int,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
    ::operator=(__return_storage_ptr__,&this->m_tree);
    break;
  case block_layer:
    iVar1 = num_pieces(this);
    container_wrapper<libtorrent::digest32<256l>,int,std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>>
    ::reserve<int,void>((container_wrapper<libtorrent::digest32<256l>,int,std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>>
                         *)__return_storage_ptr__,iVar1);
    ::std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>::vector
              ((vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_> *)
               &b);
    leafs.m_len._4_4_ = blocks_per_piece(this);
    leafs.m_len._0_4_ = 0;
    while( true ) {
      iVar1 = (int)leafs.m_len;
      sVar2 = ::std::
              vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>::size
                        (&(this->m_tree).
                          super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                        );
      if ((int)sVar2 <= iVar1) break;
      span<libtorrent::digest32<256l>const>::
      span<libtorrent::aux::container_wrapper<libtorrent::digest32<256l>,int,std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>>,libtorrent::digest32<256l>,void>
                ((span<libtorrent::digest32<256l>const> *)&local_98,&this->m_tree);
      sVar3 = span<const_libtorrent::digest32<256L>_>::subspan(&local_98,(long)(int)leafs.m_len);
      iVar1 = leafs.m_len._4_4_;
      leafs.m_ptr = (digest32<256L> *)sVar3.m_len;
      pdStack_88 = sVar3.m_ptr;
      local_c8 = sVar3;
      digest32<256L>::digest32(&local_e8);
      pad.m_number._M_elems[2] = local_e8.m_number._M_elems[2];
      pad.m_number._M_elems[3] = local_e8.m_number._M_elems[3];
      pad.m_number._M_elems[0] = local_e8.m_number._M_elems[0];
      pad.m_number._M_elems[1] = local_e8.m_number._M_elems[1];
      pad.m_number._M_elems[4] = local_e8.m_number._M_elems[4];
      pad.m_number._M_elems[5] = local_e8.m_number._M_elems[5];
      pad.m_number._M_elems[6] = local_e8.m_number._M_elems[6];
      pad.m_number._M_elems[7] = local_e8.m_number._M_elems[7];
      merkle_root_scratch(&local_b8,local_c8,iVar1,pad,
                          (vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                           *)&b);
      ::std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>::
      push_back(&__return_storage_ptr__->
                 super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                ,&local_b8);
      leafs.m_len._0_4_ = leafs.m_len._4_4_ + (int)leafs.m_len;
    }
    ::std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>::~vector
              ((vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_> *)
               &b);
  }
  return __return_storage_ptr__;
}

Assistant:

aux::vector<sha256_hash> merkle_tree::get_piece_layer() const
	{
		aux::vector<sha256_hash> ret;

		switch (m_mode)
		{
			case mode_t::uninitialized_tree: break;
			case mode_t::empty_tree: break;
			case mode_t::full_tree:
				ret.assign(m_tree.begin() + piece_layer_start()
					, m_tree.begin() + piece_layer_start() + num_pieces());
				break;
			case mode_t::piece_layer:
			{
				ret = m_tree;
				break;
			}
			case mode_t::block_layer:
			{
				ret.reserve(num_pieces());
				std::vector<sha256_hash> scratch_space;

				int const blocks_in_piece = blocks_per_piece();
				for (int b = 0; b < int(m_tree.size()); b += blocks_in_piece)
				{
					auto const leafs = span<sha256_hash const>(m_tree).subspan(b);
					ret.push_back(merkle_root_scratch(leafs, blocks_in_piece, sha256_hash{}, scratch_space));
				}
				break;
			}
		}
		return ret;
	}